

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O3

void __thiscall google::protobuf::strings::ArrayByteSource::Skip(ArrayByteSource *this,size_t n)

{
  LogMessage *other;
  ulong uVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->input_).length_;
  if (uVar1 < n) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,"third_party/protobuf-lite/bytestream.cc",0x9d);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (n) <= (input_.size()): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    uVar1 = (this->input_).length_;
  }
  if ((long)n <= (long)uVar1) {
    (this->input_).ptr_ = (this->input_).ptr_ + n;
    (this->input_).length_ = uVar1 - n;
    return;
  }
  __assert_fail("length_ >= n",
                "src/../third_party/protobuf-lite/google/protobuf/stubs/stringpiece.h",0x11a,
                "void google::protobuf::StringPiece::remove_prefix(stringpiece_ssize_type)");
}

Assistant:

void ArrayByteSource::Skip(size_t n) {
  GOOGLE_DCHECK_LE(n, input_.size());
  input_.remove_prefix(n);
}